

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringview.h
# Opt level: O3

TrimPositions QStringAlgorithms<const_QStringView>::trimmed_helper_positions(QStringView *str)

{
  storage_type_conflict sVar1;
  bool bVar2;
  Char *pCVar3;
  char32_t cVar4;
  Char *pCVar5;
  TrimPositions TVar6;
  
  pCVar5 = (Char *)str->m_data;
  pCVar3 = pCVar5 + str->m_size;
  if (0 < str->m_size) {
    do {
      sVar1 = pCVar3[-1].ucs;
      if (((4 < (ushort)sVar1 - 9) && (sVar1 != L' ')) &&
         (((ushort)sVar1 < 0x80 ||
          (((cVar4 = (char32_t)(ushort)sVar1, cVar4 != L'\x85' && (cVar4 != L'\xa0')) &&
           (bVar2 = QChar::isSpace_helper(cVar4), !bVar2)))))) break;
      pCVar3 = pCVar3 + -1;
    } while (pCVar5 < pCVar3);
  }
  while ((pCVar5 < pCVar3 &&
         (((sVar1 = pCVar5->ucs, (ushort)sVar1 - 9 < 5 || (sVar1 == L' ')) ||
          ((0x7f < (ushort)sVar1 &&
           (((cVar4 = (char32_t)(ushort)sVar1, cVar4 == L'\x85' || (cVar4 == L'\xa0')) ||
            (bVar2 = QChar::isSpace_helper(cVar4), bVar2))))))))) {
    pCVar5 = pCVar5 + 1;
  }
  TVar6.end = pCVar3;
  TVar6.begin = pCVar5;
  return TVar6;
}

Assistant:

[[nodiscard]] constexpr qsizetype size() const noexcept { return m_size; }